

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_sub_16_re_pd(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint address;
  uint uVar4;
  
  uVar2 = m68ki_cpu.ir;
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] - 2;
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = address;
  uVar1 = *(ushort *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 7 & 0x1c));
  uVar2 = m68ki_read_16_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = (uint)uVar1;
  uVar3 = uVar2 - uVar4;
  m68ki_cpu.x_flag = uVar3 >> 8;
  m68ki_cpu.not_z_flag = uVar3 & 0xffff;
  m68ki_cpu.v_flag = ((uVar3 ^ uVar2) & (uVar4 ^ uVar2)) >> 8;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_sub_16_re_pd(void)
{
	uint ea = EA_AY_PD_16();
	uint src = MASK_OUT_ABOVE_16(DX);
	uint dst = m68ki_read_16(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	m68ki_write_16(ea, FLAG_Z);
}